

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::insert
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  pair<double,_QVariant> **pppVar1;
  qsizetype *pqVar2;
  pair<double,_QVariant> *ppVar3;
  long in_FS_OFFSET;
  bool bVar4;
  Inserter local_80;
  double local_58;
  anon_union_24_3_e3d07ef4_for_data local_50;
  undefined1 *puStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = t->first;
  ::QVariant::QVariant((QVariant *)&local_50,&t->second);
  bVar4 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
          super_QArrayDataPointer<std::pair<double,_QVariant>_>.size != 0;
  QArrayDataPointer<std::pair<double,_QVariant>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<double,_QVariant>_> *)this,(uint)(i == 0 && bVar4),n,
             (pair<double,_QVariant> **)0x0,(QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0);
  if (i == 0 && bVar4) {
    if (n != 0) {
      do {
        ppVar3 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                 super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr;
        ppVar3[-1].first = local_58;
        ::QVariant::QVariant(&ppVar3[-1].second,(QVariant *)&local_50);
        pppVar1 = &(this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                   super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr;
        *pppVar1 = *pppVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                  super_QArrayDataPointer<std::pair<double,_QVariant>_>.size;
        *pqVar2 = *pqVar2 + 1;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    local_80.displaceFrom =
         (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
         super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr + i;
    local_80.displaceTo = local_80.displaceFrom + n;
    local_80.bytes =
         ((this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
          super_QArrayDataPointer<std::pair<double,_QVariant>_>.size - i) * 0x28;
    local_80.data = (QArrayDataPointer<std::pair<double,_QVariant>_> *)this;
    local_80.nInserts = n;
    memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
    if (n != 0) {
      do {
        (local_80.displaceFrom)->first = local_58;
        ::QVariant::QVariant(&(local_80.displaceFrom)->second,(QVariant *)&local_50);
        local_80.displaceFrom = local_80.displaceFrom + 1;
        n = n + -1;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_80);
  }
  ::QVariant::~QVariant((QVariant *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }